

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::addExports(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  bool bVar1;
  Ref RVar2;
  reference this_00;
  pointer pEVar3;
  reference pvVar4;
  pointer pMVar5;
  address64_t aVar6;
  address64_t aVar7;
  Ref RVar8;
  Ref *pRVar9;
  ostream *os;
  Fatal *pFVar10;
  Value *pVVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  Ref in_R8;
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString name_07;
  IString name_08;
  IString IVar12;
  IString IVar13;
  string_view param;
  IString key;
  IString key_00;
  IString key_01;
  IString key_02;
  IString key_03;
  IString key_04;
  IString key_05;
  IString key_06;
  IString key_07;
  IString key_08;
  IString op;
  IString key_09;
  Fatal local_6d8;
  char *local_550;
  size_t local_548;
  char *local_540;
  string_view local_538;
  Value *local_528;
  Value *local_520;
  string_view local_518;
  string_view local_500;
  Ref local_4f0;
  string_view local_4e8;
  Value *local_4d0;
  Ref local_4c8;
  size_t sStack_4c0;
  ValueBuilder *local_4b8;
  size_t sStack_4b0;
  Value *local_4a8;
  Value *local_4a0;
  Ref local_498;
  Ref block_1;
  IString setterParam;
  ostringstream local_450 [8];
  ostringstream buffer;
  IString local_2d0;
  ValueBuilder *local_2c0;
  ValueBuilder *local_2b8;
  size_t sStack_2b0;
  Value *local_2a0;
  Value *local_298;
  Value *local_290;
  Ref block;
  undefined1 auStack_278 [8];
  IString identName;
  Ref object;
  Ref local_238;
  Ref local_208;
  char *local_200;
  IString local_1e0;
  IString local_1d0;
  Value *local_1c0;
  Value *local_1b8;
  IString local_1b0;
  IString local_1a0;
  Value *local_190;
  Ref local_188;
  Value *local_180;
  Ref memory;
  IString local_170;
  Value *local_160;
  Value *local_158;
  IString local_150;
  Value *local_140;
  ValueBuilder *local_138;
  size_t local_130;
  Value *local_128;
  Value *local_120;
  IString local_118;
  Value *local_108;
  Ref bufferGetter;
  Ref bufferDesc;
  IString local_e0;
  Value *local_d0;
  Value *local_c8;
  IString local_c0;
  Value *local_b0;
  Value *local_a8;
  Ref growDesc;
  Ref descs;
  ValueBuilder *local_88;
  Ref local_60;
  char *local_58;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *export_;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  Ref exports;
  Module *wasm_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  
  this_local = (Wasm2JSBuilder *)ast.inst;
  RVar2 = cashew::ValueBuilder::makeObject();
  __end1 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&wasm->exports);
  export_ = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
            std::
            vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ::end(&wasm->exports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                *)&export_);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end1);
    pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_00);
    switch(pEVar3->kind) {
    case Function:
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      IVar13 = fromName(this,(pEVar3->name).super_IString.str,Export);
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      IVar12 = fromName(this,(pEVar3->value).super_IString.str,Top);
      name.str._M_str = IVar12.str._M_str;
      local_88 = (ValueBuilder *)IVar12.str._M_len;
      name.str._M_len = (size_t)name.str._M_str;
      RVar8 = cashew::ValueBuilder::makeName(local_88,name);
      local_60.inst = (Value *)IVar13.str._M_len;
      local_58 = IVar13.str._M_str;
      key.str._M_str = (char *)RVar8.inst;
      key.str._M_len = (size_t)local_58;
      cashew::ValueBuilder::appendToObjectWithQuotes((ValueBuilder *)RVar2.inst,local_60,key,in_R8);
      break;
    case Table:
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      IVar13 = fromName(this,(pEVar3->name).super_IString.str,Export);
      name_05.str._M_str = IVar13.str._M_str;
      name_05.str._M_len = WASM_MEMORY_SIZE;
      RVar8 = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_05);
      local_238.inst = (Value *)IVar13.str._M_len;
      key_07.str._M_str = (char *)RVar8.inst;
      key_07.str._M_len = (size_t)name_05.str._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)RVar2.inst,local_238,key_07,in_R8);
      break;
    case Memory:
      growDesc = cashew::ValueBuilder::makeObject();
      local_a8 = (Value *)cashew::ValueBuilder::makeObject();
      local_b0 = growDesc.inst;
      IString::IString(&local_c0,"grow");
      local_c8 = local_a8;
      key_00.str._M_str = (char *)local_a8;
      key_00.str._M_len = (size_t)local_c0.str._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)local_b0,(Ref)local_c0.str._M_len,key_00,in_R8);
      pvVar4 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&wasm->memories,0);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar4)
      ;
      aVar6 = Address::operator_cast_to_unsigned_long(&pMVar5->max);
      pvVar4 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&wasm->memories,0);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar4)
      ;
      aVar7 = Address::operator_cast_to_unsigned_long(&pMVar5->initial);
      if (aVar7 < aVar6) {
        local_d0 = local_a8;
        IString::IString(&local_e0,"value");
        name_00.str._M_str = extraout_RDX;
        name_00.str._M_len = _finalize;
        RVar8 = cashew::ValueBuilder::makeName(WASM_MEMORY_GROW,name_00);
        key_01.str._M_str = (char *)RVar8.inst;
        key_01.str._M_len = (size_t)local_e0.str._M_str;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)local_d0,(Ref)local_e0.str._M_len,key_01,in_R8);
      }
      bufferGetter = cashew::ValueBuilder::makeObject();
      IString::IString(&local_118,"");
      name_01.str._M_str = extraout_RDX_00;
      name_01.str._M_len = (size_t)local_118.str._M_str;
      local_108 = (Value *)cashew::ValueBuilder::makeFunction
                                     ((ValueBuilder *)local_118.str._M_len,name_01);
      pRVar9 = (Ref *)cashew::Ref::operator[]((uint)&local_108);
      pVVar11 = cashew::Ref::operator->(pRVar9);
      local_138 = BUFFER;
      local_130 = _operator_;
      name_02.str._M_str = extraout_RDX_01;
      name_02.str._M_len = _operator_;
      local_128 = (Value *)cashew::ValueBuilder::makeName(BUFFER,name_02);
      local_120 = (Value *)cashew::ValueBuilder::makeReturn((Ref)local_128);
      cashew::Value::push_back(pVVar11,(Ref)local_120);
      local_140 = bufferGetter.inst;
      IString::IString(&local_150,"get");
      local_158 = local_108;
      key_02.str._M_str = (char *)local_108;
      key_02.str._M_len = (size_t)local_150.str._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)local_140,(Ref)local_150.str._M_len,key_02,in_R8);
      local_160 = growDesc.inst;
      IString::IString(&local_170,"buffer");
      memory = bufferGetter;
      key_03.str._M_str = (char *)bufferGetter.inst;
      key_03.str._M_len = (size_t)local_170.str._M_str;
      RVar8 = bufferGetter;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)local_160,(Ref)local_170.str._M_len,key_03,in_R8);
      IString::IString(&local_1a0,"Object");
      name_03.str._M_str = extraout_RDX_02;
      name_03.str._M_len = (size_t)local_1a0.str._M_str;
      local_190 = (Value *)cashew::ValueBuilder::makeName
                                     ((ValueBuilder *)local_1a0.str._M_len,name_03);
      IString::IString(&local_1b0,"create");
      key_04.str._M_str = (char *)RVar8.inst;
      key_04.str._M_len = (size_t)local_1b0.str._M_str;
      local_188 = cashew::ValueBuilder::makeDot(local_190,(Ref)local_1b0.str._M_len,key_04);
      IString::IString(&local_1d0,"Object");
      name_04.str._M_str = extraout_RDX_03;
      name_04.str._M_len = (size_t)local_1d0.str._M_str;
      local_1c0 = (Value *)cashew::ValueBuilder::makeName
                                     ((ValueBuilder *)local_1d0.str._M_len,name_04);
      IString::IString(&local_1e0,"prototype");
      key_05.str._M_str = (char *)RVar8.inst;
      key_05.str._M_len = (size_t)local_1e0.str._M_str;
      local_1b8 = (Value *)cashew::ValueBuilder::makeDot
                                     ((ValueBuilder *)local_1c0,(Ref)local_1e0.str._M_len,key_05);
      local_180 = (Value *)cashew::ValueBuilder::makeCall(local_188,(Ref)local_1b8);
      cashew::ValueBuilder::appendToCall((Ref)local_180,growDesc);
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      IVar13 = fromName(this,(pEVar3->name).super_IString.str,Export);
      local_208.inst = (Value *)IVar13.str._M_len;
      local_200 = IVar13.str._M_str;
      key_06.str._M_str = (char *)local_180;
      key_06.str._M_len = (size_t)local_200;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)RVar2.inst,local_208,key_06,in_R8);
      break;
    case Global:
      identName.str._M_str = (char *)cashew::ValueBuilder::makeObject();
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      block.inst = (Value *)(pEVar3->value).super_IString.str._M_len;
      _auStack_278 = (string_view)fromName(this,(Name)(pEVar3->value).super_IString.str,Top);
      local_290 = (Value *)cashew::ValueBuilder::makeBlock();
      pRVar9 = (Ref *)cashew::Ref::operator[]((uint)&local_290);
      pVVar11 = cashew::Ref::operator->(pRVar9);
      local_2b8 = (ValueBuilder *)auStack_278;
      sStack_2b0 = identName.str._M_len;
      name_06.str._M_str = extraout_RDX_04;
      name_06.str._M_len = identName.str._M_len;
      local_2a0 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)auStack_278,name_06);
      local_298 = (Value *)cashew::ValueBuilder::makeReturn((Ref)local_2a0);
      cashew::Value::push_back(pVVar11,(Ref)local_298);
      local_2c0 = (ValueBuilder *)identName.str._M_str;
      IString::IString(&local_2d0,"value");
      key_08.str._M_str = (char *)local_290;
      key_08.str._M_len = (size_t)local_2d0.str._M_str;
      cashew::ValueBuilder::appendToObjectAsGetter(local_2c0,(Ref)local_2d0.str._M_len,key_08,in_R8)
      ;
      std::__cxx11::ostringstream::ostringstream(local_450);
      os = std::operator<<((ostream *)local_450,'_');
      std::operator<<(os,(IString *)auStack_278);
      std::__cxx11::ostringstream::str();
      param = (string_view)stringToIString((string *)&block_1);
      RVar8.inst = (Value *)param._M_str;
      std::__cxx11::string::~string((string *)&block_1);
      local_498 = cashew::ValueBuilder::makeBlock();
      pRVar9 = (Ref *)cashew::Ref::operator[]((uint)&local_498);
      pVVar11 = cashew::Ref::operator->(pRVar9);
      local_4b8 = (ValueBuilder *)auStack_278;
      sStack_4b0 = identName.str._M_len;
      name_07.str._M_str = extraout_RDX_05;
      name_07.str._M_len = identName.str._M_len;
      local_4a8 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)auStack_278,name_07);
      local_4c8.inst = cashew::SET;
      sStack_4c0 = BLOCK;
      name_08.str._M_str = extraout_RDX_06;
      name_08.str._M_len = (size_t)RVar8.inst;
      local_4e8 = param;
      local_4d0 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)param._M_len,name_08);
      op.str._M_str = (char *)local_4d0;
      op.str._M_len = sStack_4c0;
      local_4a0 = (Value *)cashew::ValueBuilder::makeBinary
                                     ((ValueBuilder *)local_4a8,local_4c8,op,in_R8);
      cashew::Value::push_back(pVVar11,(Ref)local_4a0);
      local_4f0.inst = (Value *)identName.str._M_str;
      IString::IString((IString *)&local_500,"value");
      local_520 = local_498.inst;
      local_518 = param;
      cashew::ValueBuilder::appendToObjectAsSetter
                (local_4f0,(IString)local_500,(IString)param,local_498);
      std::__cxx11::ostringstream::~ostringstream(local_450);
      local_528 = RVar2.inst;
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      local_548 = (pEVar3->name).super_IString.str._M_len;
      local_540 = (pEVar3->name).super_IString.str._M_str;
      local_538 = (string_view)fromName(this,(Name)(pEVar3->name).super_IString.str,Export);
      local_550 = identName.str._M_str;
      key_09.str._M_str = identName.str._M_str;
      key_09.str._M_len = (size_t)local_538._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)local_528,(Ref)local_538._M_len,key_09,RVar8);
      in_R8.inst = RVar8.inst;
      break;
    case Invalid:
    case Tag:
      Fatal::Fatal(&local_6d8);
      pFVar10 = Fatal::operator<<(&local_6d8,(char (*) [26])"unsupported export type: ");
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      pFVar10 = Fatal::operator<<(pFVar10,&pEVar3->name);
      Fatal::operator<<(pFVar10,(char (*) [2])0x29371c);
      Fatal::~Fatal(&local_6d8);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&wasm->memories);
  if (!bVar1) {
    addMemoryFuncs(this,(Ref)this_local,wasm);
  }
  pVVar11 = cashew::Ref::operator->((Ref *)&this_local);
  RVar2 = cashew::ValueBuilder::makeReturn(RVar2);
  RVar2 = cashew::ValueBuilder::makeStatement(RVar2);
  cashew::Value::push_back(pVVar11,RVar2);
  return;
}

Assistant:

void Wasm2JSBuilder::addExports(Ref ast, Module* wasm) {
  Ref exports = ValueBuilder::makeObject();
  for (auto& export_ : wasm->exports) {
    switch (export_->kind) {
      case ExternalKind::Function: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(fromName(export_->value, NameScope::Top)));
        break;
      }
      case ExternalKind::Memory: {
        Ref descs = ValueBuilder::makeObject();
        Ref growDesc = ValueBuilder::makeObject();
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("grow"), growDesc);
        if (wasm->memories[0]->max > wasm->memories[0]->initial) {
          ValueBuilder::appendToObjectWithQuotes(
            growDesc,
            IString("value"),
            ValueBuilder::makeName(WASM_MEMORY_GROW));
        }
        Ref bufferDesc = ValueBuilder::makeObject();
        Ref bufferGetter = ValueBuilder::makeFunction(IString(""));
        bufferGetter[3]->push_back(
          ValueBuilder::makeReturn(ValueBuilder::makeName(BUFFER)));
        ValueBuilder::appendToObjectWithQuotes(
          bufferDesc, IString("get"), bufferGetter);
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("buffer"), bufferDesc);
        Ref memory = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("create")),
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("prototype")));
        ValueBuilder::appendToCall(memory, descs);
        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), memory);
        break;
      }
      case ExternalKind::Table: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(FUNCTION_TABLE));
        break;
      }
      case ExternalKind::Global: {
        Ref object = ValueBuilder::makeObject();

        IString identName = fromName(export_->value, NameScope::Top);

        // getter
        {
          Ref block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeReturn(ValueBuilder::makeName(identName)));

          ValueBuilder::appendToObjectAsGetter(object, IString("value"), block);
        }

        // setter
        {
          std::ostringstream buffer;
          buffer << '_' << identName;
          auto setterParam = stringToIString(buffer.str());

          auto block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeBinary(ValueBuilder::makeName(identName),
                                     SET,
                                     ValueBuilder::makeName(setterParam)));

          ValueBuilder::appendToObjectAsSetter(
            object, IString("value"), setterParam, block);
        }

        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), object);

        break;
      }
      case ExternalKind::Tag:
      case ExternalKind::Invalid:
        Fatal() << "unsupported export type: " << export_->name << "\n";
    }
  }
  if (!wasm->memories.empty()) {
    addMemoryFuncs(ast, wasm);
  }
  ast->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeReturn(exports)));
}